

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::shl_limbs(bigint *this,size_t n)

{
  limb *plVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int local_44;
  limb *local_40;
  limb *last;
  limb *first;
  limb *src;
  limb *dst;
  size_t n_local;
  bigint *this_local;
  
  dst = (limb *)n;
  n_local = (size_t)this;
  sVar3 = stackvec<(unsigned_short)62>::len(&this->vec);
  sVar4 = stackvec<(unsigned_short)62>::capacity(&this->vec);
  if (sVar4 < n + sVar3) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = stackvec<(unsigned_short)62>::is_empty(&this->vec);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      src = (this->vec).data + (long)dst;
      first = (limb *)this;
      sVar3 = stackvec<(unsigned_short)62>::len(&this->vec);
      plVar1 = src;
      sVar4 = stackvec<(unsigned_short)62>::len(&this->vec);
      std::copy_backward<unsigned_long_const*,unsigned_long*>
                ((unsigned_long *)this,(this->vec).data + sVar3,plVar1 + sVar4);
      local_40 = (this->vec).data + (long)dst;
      local_44 = 0;
      last = (limb *)this;
      std::fill<unsigned_long*,int>((unsigned_long *)this,local_40,&local_44);
      plVar1 = dst;
      sVar3 = stackvec<(unsigned_short)62>::len(&this->vec);
      stackvec<(unsigned_short)62>::set_len(&this->vec,(long)plVar1 + sVar3);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl_limbs(size_t n) noexcept {
    FASTFLOAT_DEBUG_ASSERT(n != 0);
    if (n + vec.len() > vec.capacity()) {
      return false;
    } else if (!vec.is_empty()) {
      // move limbs
      limb* dst = vec.data + n;
      const limb* src = vec.data;
      std::copy_backward(src, src + vec.len(), dst + vec.len());
      // fill in empty limbs
      limb* first = vec.data;
      limb* last = first + n;
      ::std::fill(first, last, 0);
      vec.set_len(n + vec.len());
      return true;
    } else {
      return true;
    }
  }